

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStructMatrix.cpp
# Opt level: O3

int __thiscall
TPZStructMatrix::ComputeElementColors(TPZStructMatrix *this,TPZVec<int> *elementcolors)

{
  long lVar1;
  int64_t i;
  int iVar2;
  bool bVar3;
  long *plVar4;
  long lVar5;
  int iVar6;
  long j;
  long lVar7;
  TPZVec<long> elgraphindex;
  TPZGenMatrix<long> domain;
  TPZStack<long,_10> elgraph;
  int local_114;
  long local_f8;
  TPZVec<long> local_f0;
  long local_d0;
  TPZVec<int> *local_c8;
  long local_c0;
  TPZGenMatrix<long> local_b8;
  TPZManVector<long,_10> local_a0;
  
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&local_a0);
  local_f0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  local_f0.fStore = (long *)0x0;
  local_f0.fNElements = 0;
  local_f0.fNAlloc = 0;
  if ((this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    TPZCompMesh::ComputeElGraph(this->fMesh,(TPZStack<long,_10> *)&local_a0,&local_f0);
  }
  else {
    TPZCompMesh::ComputeElGraph
              (this->fMesh,(TPZStack<long,_10> *)&local_a0,&local_f0,&this->fMaterialIds);
  }
  TPZGenMatrix<long>::TPZGenMatrix
            (&local_b8,(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements,10
            );
  local_d0 = local_f0.fNElements;
  local_c0 = local_f0.fNElements + -1;
  (*elementcolors->_vptr_TPZVec[4])(elementcolors);
  local_f8 = CONCAT44(local_f8._4_4_,0xffffffff);
  iVar2 = 0;
  local_c8 = elementcolors;
  TPZVec<int>::Fill(elementcolors,(int *)&local_f8,0,-1);
  local_114 = 0;
  do {
    if (local_d0 < 2) {
      bVar3 = false;
    }
    else {
      bVar3 = false;
      lVar7 = 0;
      do {
        j = 0;
        do {
          lVar5 = (long)(int)local_f0.fStore[lVar7];
          lVar1 = local_f0.fStore[lVar7 + 1];
          while( true ) {
            if (lVar1 <= lVar5) {
              iVar6 = (int)j + local_114;
              local_c8->fStore[lVar7] = iVar6;
              if (iVar6 <= iVar2) {
                iVar6 = iVar2;
              }
              goto LAB_0133a02e;
            }
            i = local_a0.super_TPZVec<long>.fStore[lVar5];
            plVar4 = TPZGenMatrix<long>::operator()(&local_b8,i,j);
            if (*plVar4 != 0) break;
            plVar4 = TPZGenMatrix<long>::operator()(&local_b8,i,j);
            *plVar4 = 1;
            lVar5 = lVar5 + 1;
          }
          j = j + 1;
        } while (j != 10);
        bVar3 = true;
        iVar6 = iVar2;
LAB_0133a02e:
        iVar2 = iVar6;
        lVar7 = lVar7 + 1;
      } while (lVar7 != local_c0);
    }
    local_f8 = 0;
    TPZGenMatrix<long>::Fill(&local_b8,&local_f8);
    local_114 = local_114 + 10;
    if (!bVar3) {
      TPZGenMatrix<long>::~TPZGenMatrix(&local_b8);
      local_f0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
      if (local_f0.fStore != (long *)0x0) {
        operator_delete__(local_f0.fStore);
      }
      TPZManVector<long,_10>::~TPZManVector(&local_a0);
      return iVar2;
    }
  } while( true );
}

Assistant:

int TPZStructMatrix::ComputeElementColors(TPZVec<int> &elementcolors)
{
    TPZStack<int64_t> elgraph;
    TPZVec<int64_t> elgraphindex;
    if(!fMaterialIds.size())
    {
        fMesh->ComputeElGraph(elgraph, elgraphindex);
    }
    else
    {
        fMesh->ComputeElGraph(elgraph, elgraphindex, fMaterialIds);
    }
    int64_t nconnects = fMesh->NConnects();
    const int color_stored = 10;
    TPZGenMatrix<int64_t> domain(nconnects,color_stored);
    int64_t nel = elgraphindex.size()-1;
    elementcolors.resize(nel);
    elementcolors.Fill(-1);
    bool element_not_colored = true;
    int highest_color = 0;
    int min_color = 0;
    int max_color = min_color+color_stored;
    while(element_not_colored)
    {
        element_not_colored = false;
        for (int64_t el = 0; el<nel; el++) {
            int icolor;
            bool color_found = true;
            for(int icolor = 0; icolor<color_stored; icolor++)
            {
                color_found = true;
                int64_t firstnode = elgraphindex[el];
                int64_t lastnode = elgraphindex[el+1];
                for (int inod = firstnode; inod < lastnode; inod++) {
                    int64_t ic = elgraph[inod];
                    if(domain(ic,icolor) != 0)
                    {
                        color_found = false;
                        break;
                    }
                    domain(ic,icolor) = 1;
                }
                if(color_found == true)
                {
                    elementcolors[el] = min_color+icolor;
                    if(min_color+icolor > highest_color) highest_color = min_color+icolor;
                    break;
                }
            }
            // the element didn't fit any color, the loop will have to be executed again
            if(!color_found) element_not_colored = true;
        }
        min_color += color_stored;
        max_color += color_stored;
        domain.Fill(0);
    }
    return highest_color;
}